

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

ByteData *
cfd::core::WallyUtil::ConvertMnemonicToEntropy
          (ByteData *__return_storage_ptr__,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *language,bool use_ideographic_space)

{
  CfdException *this;
  uchar *bytes_out;
  size_type len;
  undefined8 uVar1;
  allocator_type *in_stack_fffffffffffffec0;
  string *message;
  size_type in_stack_fffffffffffffec8;
  CfdError error_code;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffed0;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  int local_b4;
  size_t sStack_b0;
  int ret;
  size_t out_size;
  undefined1 local_a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy_bytes;
  string mnemonic_sentence;
  allocator local_51;
  string local_50 [8];
  string delimitor;
  words *wally_wordlist;
  bool use_ideographic_space_local;
  string *language_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *mnemonic_local;
  ByteData *entropy;
  
  delimitor.field_2._8_8_ = Bip39GetWordlist(language);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_50," ",&local_51);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (use_ideographic_space) {
    ::std::__cxx11::string::operator=(local_50,"0");
  }
  StringUtil::Join((StringUtil *)
                   &entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)mnemonic,(string *)local_50);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3fa8d9);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3fa8ff);
  sStack_b0 = 0;
  uVar1 = delimitor.field_2._8_8_;
  this = (CfdException *)::std::__cxx11::string::c_str();
  message = (string *)local_a0;
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3fa938);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  local_b4 = bip39_mnemonic_to_bytes
                       ((words *)uVar1,(char *)this,bytes_out,len,&stack0xffffffffffffff50);
  if (local_b4 == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,uVar1);
    ByteData::ByteData(__return_storage_ptr__,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    ::std::__cxx11::string::~string
              ((string *)
               &entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string(local_50);
    return __return_storage_ptr__;
  }
  local_d0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_wally_util.cpp"
               ,0x2f);
  error_code = (CfdError)((ulong)uVar1 >> 0x20);
  local_d0.filename = local_d0.filename + 1;
  local_d0.line = 0x10e;
  local_d0.funcname = "ConvertMnemonicToEntropy";
  logger::warn<int&>(&local_d0,"Convert mnemonic to entropy error. ret=[{}]",&local_b4);
  uVar1 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_f0,"Convert mnemonic to entropy error.",&local_f1);
  CfdException::CfdException(this,error_code,message);
  __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData WallyUtil::ConvertMnemonicToEntropy(
    const std::vector<std::string>& mnemonic, const std::string& language,
    bool use_ideographic_space) {
  words* wally_wordlist = Bip39GetWordlist(language);

  std::string delimitor = kMnemonicDelimiter;
  if (use_ideographic_space) {
    delimitor = kMnemonicIdeographicDelimiter;
  }
  std::string mnemonic_sentence = StringUtil::Join(mnemonic, delimitor);

  std::vector<uint8_t> entropy_bytes(kByteData512Length);
  size_t out_size = 0;
  int ret = bip39_mnemonic_to_bytes(
      wally_wordlist, mnemonic_sentence.c_str(), entropy_bytes.data(),
      entropy_bytes.size(), &out_size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Convert mnemonic to entropy error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Convert mnemonic to entropy error.");
  }

  entropy_bytes.resize(out_size);
  ByteData entropy(entropy_bytes);

  return entropy;
}